

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O3

int Quantize2Blocks_SSE2(int16_t *in,int16_t *out,VP8Matrix *mtx)

{
  short sVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  uint16_t uVar9;
  uint16_t uVar10;
  uint16_t uVar11;
  uint16_t uVar12;
  uint16_t uVar13;
  uint16_t uVar14;
  uint16_t uVar15;
  uint16_t uVar16;
  uint16_t uVar17;
  uint16_t uVar18;
  uint16_t uVar19;
  uint16_t uVar20;
  uint16_t uVar21;
  uint16_t uVar22;
  uint16_t uVar23;
  uint16_t uVar24;
  uint16_t uVar25;
  uint16_t uVar26;
  uint16_t uVar27;
  uint16_t uVar28;
  uint16_t uVar29;
  uint16_t uVar30;
  uint16_t uVar31;
  uint16_t uVar32;
  uint16_t uVar33;
  uint16_t uVar34;
  uint16_t uVar35;
  uint16_t uVar36;
  uint16_t uVar37;
  uint16_t uVar38;
  uint32_t uVar39;
  uint32_t uVar40;
  uint32_t uVar41;
  uint32_t uVar42;
  uint32_t uVar43;
  uint32_t uVar44;
  uint32_t uVar45;
  uint32_t uVar46;
  uint32_t uVar47;
  uint32_t uVar48;
  uint32_t uVar49;
  uint32_t uVar50;
  uint32_t uVar51;
  uint32_t uVar52;
  uint32_t uVar53;
  uint32_t uVar54;
  undefined1 auVar55 [12];
  undefined1 auVar56 [12];
  undefined1 auVar57 [12];
  undefined1 auVar58 [12];
  unkbyte10 Var59;
  unkbyte10 Var60;
  int iVar61;
  int iVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  short sVar69;
  short sVar71;
  short sVar72;
  short sVar73;
  short sVar74;
  short sVar75;
  short sVar76;
  short sVar77;
  undefined1 auVar70 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  int iVar80;
  undefined1 auVar82 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [12];
  short sVar89;
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  int iVar90;
  short sVar95;
  undefined1 auVar92 [16];
  undefined1 auVar94 [16];
  short sVar96;
  short sVar102;
  short sVar103;
  short sVar104;
  short sVar105;
  short sVar106;
  short sVar107;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  short sVar108;
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  short sVar115;
  undefined1 auVar116 [12];
  short sVar121;
  short sVar122;
  short sVar123;
  short sVar124;
  short sVar125;
  short sVar126;
  short sVar127;
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar120 [16];
  undefined1 auVar81 [12];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [12];
  undefined1 auVar93 [16];
  undefined1 auVar119 [16];
  
  auVar70 = *(undefined1 (*) [16])in;
  auVar78 = *(undefined1 (*) [16])(in + 8);
  uVar7 = mtx->q_[0];
  uVar8 = mtx->q_[1];
  uVar9 = mtx->q_[2];
  uVar10 = mtx->q_[3];
  uVar11 = mtx->q_[4];
  uVar12 = mtx->q_[5];
  uVar13 = mtx->q_[6];
  uVar14 = mtx->q_[7];
  uVar15 = mtx->q_[8];
  uVar16 = mtx->q_[9];
  uVar17 = mtx->q_[10];
  uVar18 = mtx->q_[0xb];
  uVar19 = mtx->q_[0xc];
  uVar20 = mtx->q_[0xd];
  uVar21 = mtx->q_[0xe];
  uVar22 = mtx->q_[0xf];
  auVar63 = *(undefined1 (*) [16])mtx->iq_;
  auVar66 = *(undefined1 (*) [16])(mtx->iq_ + 8);
  sVar69 = auVar70._0_2_;
  sVar89 = -sVar69;
  sVar71 = auVar70._2_2_;
  sVar95 = -sVar71;
  sVar72 = auVar70._4_2_;
  sVar1 = -sVar72;
  sVar73 = auVar70._6_2_;
  sVar2 = -sVar73;
  sVar74 = auVar70._8_2_;
  sVar3 = -sVar74;
  sVar75 = auVar70._10_2_;
  sVar4 = -sVar75;
  sVar76 = auVar70._12_2_;
  sVar5 = -sVar76;
  sVar77 = auVar70._14_2_;
  sVar6 = -sVar77;
  auVar70 = psraw(auVar70,0xf);
  sVar115 = auVar78._0_2_;
  sVar96 = -sVar115;
  sVar121 = auVar78._2_2_;
  sVar102 = -sVar121;
  sVar122 = auVar78._4_2_;
  sVar103 = -sVar122;
  sVar123 = auVar78._6_2_;
  sVar104 = -sVar123;
  sVar124 = auVar78._8_2_;
  sVar105 = -sVar124;
  sVar125 = auVar78._10_2_;
  sVar106 = -sVar125;
  sVar126 = auVar78._12_2_;
  sVar107 = -sVar126;
  sVar127 = auVar78._14_2_;
  sVar108 = -sVar127;
  auVar117 = psraw(auVar78,0xf);
  uVar23 = mtx->sharpen_[0];
  uVar24 = mtx->sharpen_[1];
  uVar25 = mtx->sharpen_[2];
  uVar26 = mtx->sharpen_[3];
  uVar27 = mtx->sharpen_[4];
  uVar28 = mtx->sharpen_[5];
  uVar29 = mtx->sharpen_[6];
  uVar30 = mtx->sharpen_[7];
  uVar31 = mtx->sharpen_[8];
  uVar32 = mtx->sharpen_[9];
  uVar33 = mtx->sharpen_[10];
  uVar34 = mtx->sharpen_[0xb];
  uVar35 = mtx->sharpen_[0xc];
  uVar36 = mtx->sharpen_[0xd];
  uVar37 = mtx->sharpen_[0xe];
  uVar38 = mtx->sharpen_[0xf];
  auVar92._0_2_ =
       ((ushort)(sVar89 < sVar69) * sVar69 | (ushort)(sVar89 >= sVar69) * sVar89) + uVar23;
  auVar92._2_2_ =
       ((ushort)(sVar95 < sVar71) * sVar71 | (ushort)(sVar95 >= sVar71) * sVar95) + uVar24;
  auVar92._4_2_ = ((ushort)(sVar1 < sVar72) * sVar72 | (ushort)(sVar1 >= sVar72) * sVar1) + uVar25;
  auVar92._6_2_ = ((ushort)(sVar2 < sVar73) * sVar73 | (ushort)(sVar2 >= sVar73) * sVar2) + uVar26;
  auVar92._8_2_ = ((ushort)(sVar3 < sVar74) * sVar74 | (ushort)(sVar3 >= sVar74) * sVar3) + uVar27;
  auVar92._10_2_ = ((ushort)(sVar4 < sVar75) * sVar75 | (ushort)(sVar4 >= sVar75) * sVar4) + uVar28;
  auVar92._12_2_ = ((ushort)(sVar5 < sVar76) * sVar76 | (ushort)(sVar5 >= sVar76) * sVar5) + uVar29;
  auVar92._14_2_ = ((ushort)(sVar6 < sVar77) * sVar77 | (ushort)(sVar6 >= sVar77) * sVar6) + uVar30;
  auVar86._0_2_ =
       ((ushort)(sVar96 < sVar115) * sVar115 | (ushort)(sVar96 >= sVar115) * sVar96) + uVar31;
  auVar86._2_2_ =
       ((ushort)(sVar102 < sVar121) * sVar121 | (ushort)(sVar102 >= sVar121) * sVar102) + uVar32;
  auVar86._4_2_ =
       ((ushort)(sVar103 < sVar122) * sVar122 | (ushort)(sVar103 >= sVar122) * sVar103) + uVar33;
  auVar86._6_2_ =
       ((ushort)(sVar104 < sVar123) * sVar123 | (ushort)(sVar104 >= sVar123) * sVar104) + uVar34;
  auVar86._8_2_ =
       ((ushort)(sVar105 < sVar124) * sVar124 | (ushort)(sVar105 >= sVar124) * sVar105) + uVar35;
  auVar86._10_2_ =
       ((ushort)(sVar106 < sVar125) * sVar125 | (ushort)(sVar106 >= sVar125) * sVar106) + uVar36;
  auVar86._12_2_ =
       ((ushort)(sVar107 < sVar126) * sVar126 | (ushort)(sVar107 >= sVar126) * sVar107) + uVar37;
  auVar86._14_2_ =
       ((ushort)(sVar108 < sVar127) * sVar127 | (ushort)(sVar108 >= sVar127) * sVar108) + uVar38;
  auVar78 = pmulhuw(auVar92,auVar63);
  sVar95 = auVar92._6_2_ * auVar63._6_2_;
  auVar79 = pmulhuw(auVar86,auVar66);
  sVar89 = auVar86._6_2_ * auVar66._6_2_;
  iVar61 = CONCAT22(auVar78._6_2_,sVar95);
  Var59 = CONCAT64(CONCAT42(iVar61,auVar78._4_2_),CONCAT22(auVar92._4_2_ * auVar63._4_2_,sVar95));
  auVar55._4_8_ = (long)((unkuint10)Var59 >> 0x10);
  auVar55._2_2_ = auVar78._2_2_;
  auVar55._0_2_ = auVar92._2_2_ * auVar63._2_2_;
  iVar90 = CONCAT22(auVar78._8_2_,auVar92._8_2_ * auVar63._8_2_);
  auVar91._0_8_ = CONCAT26(auVar78._10_2_,CONCAT24(auVar92._10_2_ * auVar63._10_2_,iVar90));
  auVar91._8_2_ = auVar92._12_2_ * auVar63._12_2_;
  auVar91._10_2_ = auVar78._12_2_;
  auVar93._12_2_ = auVar92._14_2_ * auVar63._14_2_;
  auVar93._0_12_ = auVar91;
  auVar93._14_2_ = auVar78._14_2_;
  iVar62 = CONCAT22(auVar79._6_2_,sVar89);
  Var60 = CONCAT64(CONCAT42(iVar62,auVar79._4_2_),CONCAT22(auVar86._4_2_ * auVar66._4_2_,sVar89));
  auVar56._4_8_ = (long)((unkuint10)Var60 >> 0x10);
  auVar56._2_2_ = auVar79._2_2_;
  auVar56._0_2_ = auVar86._2_2_ * auVar66._2_2_;
  iVar80 = CONCAT22(auVar79._8_2_,auVar86._8_2_ * auVar66._8_2_);
  auVar85._0_8_ = CONCAT26(auVar79._10_2_,CONCAT24(auVar86._10_2_ * auVar66._10_2_,iVar80));
  auVar85._8_2_ = auVar86._12_2_ * auVar66._12_2_;
  auVar85._10_2_ = auVar79._12_2_;
  auVar87._12_2_ = auVar86._14_2_ * auVar66._14_2_;
  auVar87._0_12_ = auVar85;
  auVar87._14_2_ = auVar79._14_2_;
  uVar39 = mtx->bias_[0];
  uVar40 = mtx->bias_[1];
  uVar41 = mtx->bias_[2];
  uVar42 = mtx->bias_[3];
  uVar43 = mtx->bias_[4];
  uVar44 = mtx->bias_[5];
  uVar45 = mtx->bias_[6];
  uVar46 = mtx->bias_[7];
  uVar47 = mtx->bias_[8];
  uVar48 = mtx->bias_[9];
  uVar49 = mtx->bias_[10];
  uVar50 = mtx->bias_[0xb];
  auVar109._0_4_ = (int)(CONCAT22(auVar78._0_2_,auVar92._0_2_ * auVar63._0_2_) + uVar39) >> 0x11;
  auVar109._4_4_ = (int)(auVar55._0_4_ + uVar40) >> 0x11;
  auVar109._8_4_ = (int)((int)((unkuint10)Var59 >> 0x10) + uVar41) >> 0x11;
  auVar109._12_4_ = (int)(iVar61 + uVar42) >> 0x11;
  auVar94._0_4_ = (int)(iVar90 + uVar43) >> 0x11;
  auVar94._4_4_ = (int)((int)((ulong)auVar91._0_8_ >> 0x20) + uVar44) >> 0x11;
  auVar94._8_4_ = (int)(auVar91._8_4_ + uVar45) >> 0x11;
  auVar94._12_4_ = (int)(auVar93._12_4_ + uVar46) >> 0x11;
  auVar110 = packssdw(auVar109,auVar94);
  uVar51 = mtx->bias_[0xc];
  uVar52 = mtx->bias_[0xd];
  uVar53 = mtx->bias_[0xe];
  uVar54 = mtx->bias_[0xf];
  auVar97._0_4_ = (int)(CONCAT22(auVar79._0_2_,auVar86._0_2_ * auVar66._0_2_) + uVar47) >> 0x11;
  auVar97._4_4_ = (int)(auVar56._0_4_ + uVar48) >> 0x11;
  auVar97._8_4_ = (int)((int)((unkuint10)Var60 >> 0x10) + uVar49) >> 0x11;
  auVar97._12_4_ = (int)(iVar62 + uVar50) >> 0x11;
  auVar88._0_4_ = (int)(iVar80 + uVar51) >> 0x11;
  auVar88._4_4_ = (int)((int)((ulong)auVar85._0_8_ >> 0x20) + uVar52) >> 0x11;
  auVar88._8_4_ = (int)(auVar85._8_4_ + uVar53) >> 0x11;
  auVar88._12_4_ = (int)(auVar87._12_4_ + uVar54) >> 0x11;
  auVar78 = packssdw(auVar97,auVar88);
  sVar89 = auVar110._0_2_;
  auVar111._0_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar110._2_2_;
  auVar111._2_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar110._4_2_;
  auVar111._4_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar110._6_2_;
  auVar111._6_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar110._8_2_;
  auVar111._8_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar110._10_2_;
  auVar111._10_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar110._12_2_;
  sVar95 = auVar110._14_2_;
  auVar111._12_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  auVar111._14_2_ = (ushort)(0x7ff < sVar95) * 0x7ff | (ushort)(0x7ff >= sVar95) * sVar95;
  auVar111 = auVar111 ^ auVar70;
  auVar112._0_2_ = auVar111._0_2_ - auVar70._0_2_;
  auVar112._2_2_ = auVar111._2_2_ - auVar70._2_2_;
  auVar112._4_2_ = auVar111._4_2_ - auVar70._4_2_;
  auVar112._6_2_ = auVar111._6_2_ - auVar70._6_2_;
  auVar112._8_2_ = auVar111._8_2_ - auVar70._8_2_;
  auVar112._10_2_ = auVar111._10_2_ - auVar70._10_2_;
  auVar112._12_2_ = auVar111._12_2_ - auVar70._12_2_;
  auVar112._14_2_ = auVar111._14_2_ - auVar70._14_2_;
  sVar89 = auVar78._0_2_;
  auVar98._0_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar78._2_2_;
  auVar98._2_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar78._4_2_;
  auVar98._4_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar78._6_2_;
  auVar98._6_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar78._8_2_;
  auVar98._8_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar78._10_2_;
  auVar98._10_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar78._12_2_;
  sVar95 = auVar78._14_2_;
  auVar98._12_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  auVar98._14_2_ = (ushort)(0x7ff < sVar95) * 0x7ff | (ushort)(0x7ff >= sVar95) * sVar95;
  auVar98 = auVar98 ^ auVar117;
  auVar99._0_2_ = auVar98._0_2_ - auVar117._0_2_;
  auVar99._2_2_ = auVar98._2_2_ - auVar117._2_2_;
  auVar99._4_2_ = auVar98._4_2_ - auVar117._4_2_;
  auVar99._6_2_ = auVar98._6_2_ - auVar117._6_2_;
  auVar99._8_2_ = auVar98._8_2_ - auVar117._8_2_;
  auVar99._10_2_ = auVar98._10_2_ - auVar117._10_2_;
  auVar99._12_2_ = auVar98._12_2_ - auVar117._12_2_;
  auVar99._14_2_ = auVar98._14_2_ - auVar117._14_2_;
  auVar70 = pshufhw(auVar117,auVar112,0xc6);
  auVar113._0_2_ = auVar112._0_2_ * uVar7;
  auVar113._2_2_ = auVar112._2_2_ * uVar8;
  auVar113._4_2_ = auVar112._4_2_ * uVar9;
  auVar113._6_2_ = auVar112._6_2_ * uVar10;
  auVar113._8_2_ = auVar112._8_2_ * uVar11;
  auVar113._10_2_ = auVar112._10_2_ * uVar12;
  auVar113._12_2_ = auVar112._12_2_ * uVar13;
  auVar113._14_2_ = auVar112._14_2_ * uVar14;
  *(undefined1 (*) [16])in = auVar113;
  auVar78 = pshuflw(auVar113,auVar99,0xc6);
  in[8] = auVar99._0_2_ * uVar15;
  in[9] = auVar99._2_2_ * uVar16;
  in[10] = auVar99._4_2_ * uVar17;
  in[0xb] = auVar99._6_2_ * uVar18;
  in[0xc] = auVar99._8_2_ * uVar19;
  in[0xd] = auVar99._10_2_ * uVar20;
  in[0xe] = auVar99._12_2_ * uVar21;
  in[0xf] = auVar99._14_2_ * uVar22;
  auVar100._4_4_ = auVar70._12_4_;
  auVar100._0_4_ = auVar70._0_4_;
  auVar100._8_4_ = auVar70._8_4_;
  auVar100._12_4_ = auVar70._4_4_;
  auVar70 = pshufhw(auVar100,auVar100,0x39);
  auVar114._0_4_ = auVar78._0_4_;
  auVar114._12_4_ = auVar78._12_4_;
  auVar114._4_4_ = auVar78._8_4_;
  auVar114._8_4_ = auVar78._4_4_;
  auVar78 = pshuflw(auVar114,auVar114,0x39);
  *(undefined1 (*) [16])out = auVar70;
  *(undefined1 (*) [16])(out + 8) = auVar78;
  auVar70 = packsswb(auVar70,auVar78);
  out[3] = auVar99._0_2_;
  out[0xc] = auVar112._14_2_;
  auVar101[0] = -(auVar70[0] == '\0');
  auVar101[1] = -(auVar70[1] == '\0');
  auVar101[2] = -(auVar70[2] == '\0');
  auVar101[3] = -(auVar70[3] == '\0');
  auVar101[4] = -(auVar70[4] == '\0');
  auVar101[5] = -(auVar70[5] == '\0');
  auVar101[6] = -(auVar70[6] == '\0');
  auVar101[7] = -(auVar70[7] == '\0');
  auVar101[8] = -(auVar70[8] == '\0');
  auVar101[9] = -(auVar70[9] == '\0');
  auVar101[10] = -(auVar70[10] == '\0');
  auVar101[0xb] = -(auVar70[0xb] == '\0');
  auVar101[0xc] = -(auVar70[0xc] == '\0');
  auVar101[0xd] = -(auVar70[0xd] == '\0');
  auVar101[0xe] = -(auVar70[0xe] == '\0');
  auVar101[0xf] = -(auVar70[0xf] == '\0');
  auVar70 = *(undefined1 (*) [16])(in + 0x10);
  auVar78 = *(undefined1 (*) [16])(in + 0x18);
  sVar96 = auVar70._0_2_;
  sVar89 = -sVar96;
  sVar102 = auVar70._2_2_;
  sVar95 = -sVar102;
  sVar103 = auVar70._4_2_;
  sVar1 = -sVar103;
  sVar104 = auVar70._6_2_;
  sVar2 = -sVar104;
  sVar105 = auVar70._8_2_;
  sVar3 = -sVar105;
  sVar106 = auVar70._10_2_;
  sVar4 = -sVar106;
  sVar107 = auVar70._12_2_;
  sVar5 = -sVar107;
  sVar108 = auVar70._14_2_;
  sVar6 = -sVar108;
  auVar118._0_2_ =
       ((ushort)(sVar89 < sVar96) * sVar96 | (ushort)(sVar89 >= sVar96) * sVar89) + uVar23;
  auVar118._2_2_ =
       ((ushort)(sVar95 < sVar102) * sVar102 | (ushort)(sVar95 >= sVar102) * sVar95) + uVar24;
  auVar118._4_2_ =
       ((ushort)(sVar1 < sVar103) * sVar103 | (ushort)(sVar1 >= sVar103) * sVar1) + uVar25;
  auVar118._6_2_ =
       ((ushort)(sVar2 < sVar104) * sVar104 | (ushort)(sVar2 >= sVar104) * sVar2) + uVar26;
  auVar118._8_2_ =
       ((ushort)(sVar3 < sVar105) * sVar105 | (ushort)(sVar3 >= sVar105) * sVar3) + uVar27;
  auVar118._10_2_ =
       ((ushort)(sVar4 < sVar106) * sVar106 | (ushort)(sVar4 >= sVar106) * sVar4) + uVar28;
  auVar118._12_2_ =
       ((ushort)(sVar5 < sVar107) * sVar107 | (ushort)(sVar5 >= sVar107) * sVar5) + uVar29;
  auVar118._14_2_ =
       ((ushort)(sVar6 < sVar108) * sVar108 | (ushort)(sVar6 >= sVar108) * sVar6) + uVar30;
  sVar96 = auVar78._0_2_;
  sVar89 = -sVar96;
  sVar102 = auVar78._2_2_;
  sVar95 = -sVar102;
  sVar103 = auVar78._4_2_;
  sVar1 = -sVar103;
  sVar104 = auVar78._6_2_;
  sVar2 = -sVar104;
  sVar105 = auVar78._8_2_;
  sVar3 = -sVar105;
  sVar106 = auVar78._10_2_;
  sVar4 = -sVar106;
  sVar107 = auVar78._12_2_;
  sVar5 = -sVar107;
  sVar108 = auVar78._14_2_;
  sVar6 = -sVar108;
  auVar82._0_2_ =
       ((ushort)(sVar89 < sVar96) * sVar96 | (ushort)(sVar89 >= sVar96) * sVar89) + uVar31;
  auVar82._2_2_ =
       ((ushort)(sVar95 < sVar102) * sVar102 | (ushort)(sVar95 >= sVar102) * sVar95) + uVar32;
  auVar82._4_2_ =
       ((ushort)(sVar1 < sVar103) * sVar103 | (ushort)(sVar1 >= sVar103) * sVar1) + uVar33;
  auVar82._6_2_ =
       ((ushort)(sVar2 < sVar104) * sVar104 | (ushort)(sVar2 >= sVar104) * sVar2) + uVar34;
  auVar82._8_2_ =
       ((ushort)(sVar3 < sVar105) * sVar105 | (ushort)(sVar3 >= sVar105) * sVar3) + uVar35;
  auVar82._10_2_ =
       ((ushort)(sVar4 < sVar106) * sVar106 | (ushort)(sVar4 >= sVar106) * sVar4) + uVar36;
  auVar82._12_2_ =
       ((ushort)(sVar5 < sVar107) * sVar107 | (ushort)(sVar5 >= sVar107) * sVar5) + uVar37;
  auVar82._14_2_ =
       ((ushort)(sVar6 < sVar108) * sVar108 | (ushort)(sVar6 >= sVar108) * sVar6) + uVar38;
  auVar79 = pmulhuw(auVar118,auVar63);
  sVar95 = auVar118._6_2_ * auVar63._6_2_;
  auVar117 = pmulhuw(auVar82,auVar66);
  sVar89 = auVar82._6_2_ * auVar66._6_2_;
  iVar61 = CONCAT22(auVar79._6_2_,sVar95);
  Var59 = CONCAT64(CONCAT42(iVar61,auVar79._4_2_),CONCAT22(auVar118._4_2_ * auVar63._4_2_,sVar95));
  auVar57._4_8_ = (long)((unkuint10)Var59 >> 0x10);
  auVar57._2_2_ = auVar79._2_2_;
  auVar57._0_2_ = auVar118._2_2_ * auVar63._2_2_;
  iVar90 = CONCAT22(auVar79._8_2_,auVar118._8_2_ * auVar63._8_2_);
  auVar116._0_8_ = CONCAT26(auVar79._10_2_,CONCAT24(auVar118._10_2_ * auVar63._10_2_,iVar90));
  auVar116._8_2_ = auVar118._12_2_ * auVar63._12_2_;
  auVar116._10_2_ = auVar79._12_2_;
  auVar119._12_2_ = auVar118._14_2_ * auVar63._14_2_;
  auVar119._0_12_ = auVar116;
  auVar119._14_2_ = auVar79._14_2_;
  iVar62 = CONCAT22(auVar117._6_2_,sVar89);
  Var60 = CONCAT64(CONCAT42(iVar62,auVar117._4_2_),CONCAT22(auVar82._4_2_ * auVar66._4_2_,sVar89));
  auVar58._4_8_ = (long)((unkuint10)Var60 >> 0x10);
  auVar58._2_2_ = auVar117._2_2_;
  auVar58._0_2_ = auVar82._2_2_ * auVar66._2_2_;
  iVar80 = CONCAT22(auVar117._8_2_,auVar82._8_2_ * auVar66._8_2_);
  auVar81._0_8_ = CONCAT26(auVar117._10_2_,CONCAT24(auVar82._10_2_ * auVar66._10_2_,iVar80));
  auVar81._8_2_ = auVar82._12_2_ * auVar66._12_2_;
  auVar81._10_2_ = auVar117._12_2_;
  auVar83._12_2_ = auVar82._14_2_ * auVar66._14_2_;
  auVar83._0_12_ = auVar81;
  auVar83._14_2_ = auVar117._14_2_;
  auVar110._0_4_ = (int)(CONCAT22(auVar79._0_2_,auVar118._0_2_ * auVar63._0_2_) + uVar39) >> 0x11;
  auVar110._4_4_ = (int)(auVar57._0_4_ + uVar40) >> 0x11;
  auVar110._8_4_ = (int)((int)((unkuint10)Var59 >> 0x10) + uVar41) >> 0x11;
  auVar110._12_4_ = (int)(iVar61 + uVar42) >> 0x11;
  auVar120._0_4_ = (int)(iVar90 + uVar43) >> 0x11;
  auVar120._4_4_ = (int)((int)((ulong)auVar116._0_8_ >> 0x20) + uVar44) >> 0x11;
  auVar120._8_4_ = (int)(auVar116._8_4_ + uVar45) >> 0x11;
  auVar120._12_4_ = (int)(auVar119._12_4_ + uVar46) >> 0x11;
  auVar63 = packssdw(auVar110,auVar120);
  auVar65._0_4_ = (int)(CONCAT22(auVar117._0_2_,auVar82._0_2_ * auVar66._0_2_) + uVar47) >> 0x11;
  auVar65._4_4_ = (int)(auVar58._0_4_ + uVar48) >> 0x11;
  auVar65._8_4_ = (int)((int)((unkuint10)Var60 >> 0x10) + uVar49) >> 0x11;
  auVar65._12_4_ = (int)(iVar62 + uVar50) >> 0x11;
  auVar84._0_4_ = (int)(iVar80 + uVar51) >> 0x11;
  auVar84._4_4_ = (int)((int)((ulong)auVar81._0_8_ >> 0x20) + uVar52) >> 0x11;
  auVar84._8_4_ = (int)(auVar81._8_4_ + uVar53) >> 0x11;
  auVar84._12_4_ = (int)(auVar83._12_4_ + uVar54) >> 0x11;
  auVar66 = packssdw(auVar65,auVar84);
  sVar89 = auVar63._0_2_;
  auVar117._0_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar63._2_2_;
  auVar117._2_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar63._4_2_;
  auVar117._4_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar63._6_2_;
  auVar117._6_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar63._8_2_;
  auVar117._8_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar63._10_2_;
  auVar117._10_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar63._12_2_;
  sVar95 = auVar63._14_2_;
  auVar117._12_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  auVar117._14_2_ = (ushort)(0x7ff < sVar95) * 0x7ff | (ushort)(0x7ff >= sVar95) * sVar95;
  sVar89 = auVar66._0_2_;
  auVar67._0_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar66._2_2_;
  auVar67._2_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar66._4_2_;
  auVar67._4_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar66._6_2_;
  auVar67._6_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar66._8_2_;
  auVar67._8_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar66._10_2_;
  auVar67._10_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  sVar89 = auVar66._12_2_;
  sVar95 = auVar66._14_2_;
  auVar67._12_2_ = (ushort)(0x7ff < sVar89) * 0x7ff | (ushort)(0x7ff >= sVar89) * sVar89;
  auVar67._14_2_ = (ushort)(0x7ff < sVar95) * 0x7ff | (ushort)(0x7ff >= sVar95) * sVar95;
  auVar70 = psraw(auVar70,0xf);
  auVar117 = auVar117 ^ auVar70;
  auVar64._0_2_ = auVar117._0_2_ - auVar70._0_2_;
  auVar64._2_2_ = auVar117._2_2_ - auVar70._2_2_;
  auVar64._4_2_ = auVar117._4_2_ - auVar70._4_2_;
  auVar64._6_2_ = auVar117._6_2_ - auVar70._6_2_;
  auVar64._8_2_ = auVar117._8_2_ - auVar70._8_2_;
  auVar64._10_2_ = auVar117._10_2_ - auVar70._10_2_;
  auVar64._12_2_ = auVar117._12_2_ - auVar70._12_2_;
  auVar64._14_2_ = auVar117._14_2_ - auVar70._14_2_;
  auVar70 = psraw(auVar78,0xf);
  auVar67 = auVar67 ^ auVar70;
  auVar68._0_2_ = auVar67._0_2_ - auVar70._0_2_;
  auVar68._2_2_ = auVar67._2_2_ - auVar70._2_2_;
  auVar68._4_2_ = auVar67._4_2_ - auVar70._4_2_;
  auVar68._6_2_ = auVar67._6_2_ - auVar70._6_2_;
  auVar68._8_2_ = auVar67._8_2_ - auVar70._8_2_;
  auVar68._10_2_ = auVar67._10_2_ - auVar70._10_2_;
  auVar68._12_2_ = auVar67._12_2_ - auVar70._12_2_;
  auVar68._14_2_ = auVar67._14_2_ - auVar70._14_2_;
  auVar70._0_2_ = uVar7 * auVar64._0_2_;
  auVar70._2_2_ = uVar8 * auVar64._2_2_;
  auVar70._4_2_ = uVar9 * auVar64._4_2_;
  auVar70._6_2_ = uVar10 * auVar64._6_2_;
  auVar70._8_2_ = uVar11 * auVar64._8_2_;
  auVar70._10_2_ = uVar12 * auVar64._10_2_;
  auVar70._12_2_ = uVar13 * auVar64._12_2_;
  auVar70._14_2_ = uVar14 * auVar64._14_2_;
  auVar66._0_2_ = uVar15 * auVar68._0_2_;
  auVar66._2_2_ = uVar16 * auVar68._2_2_;
  auVar66._4_2_ = uVar17 * auVar68._4_2_;
  auVar66._6_2_ = uVar18 * auVar68._6_2_;
  auVar66._8_2_ = uVar19 * auVar68._8_2_;
  auVar66._10_2_ = uVar20 * auVar68._10_2_;
  auVar66._12_2_ = uVar21 * auVar68._12_2_;
  auVar66._14_2_ = uVar22 * auVar68._14_2_;
  *(undefined1 (*) [16])(in + 0x10) = auVar70;
  *(undefined1 (*) [16])(in + 0x18) = auVar66;
  auVar70 = pshufhw(auVar70,auVar64,0xc6);
  auVar78._0_4_ = auVar70._0_4_;
  auVar78._8_4_ = auVar70._8_4_;
  auVar78._4_4_ = auVar70._12_4_;
  auVar78._12_4_ = auVar70._4_4_;
  auVar70 = pshufhw(auVar78,auVar78,0x39);
  auVar78 = pshuflw(auVar66,auVar68,0xc6);
  auVar79._0_4_ = auVar78._0_4_;
  auVar79._12_4_ = auVar78._12_4_;
  auVar79._4_4_ = auVar78._8_4_;
  auVar79._8_4_ = auVar78._4_4_;
  auVar78 = pshuflw(auVar79,auVar79,0x39);
  *(undefined1 (*) [16])(out + 0x10) = auVar70;
  *(undefined1 (*) [16])(out + 0x18) = auVar78;
  auVar70 = packsswb(auVar70,auVar78);
  auVar63[0] = -(auVar70[0] == '\0');
  auVar63[1] = -(auVar70[1] == '\0');
  auVar63[2] = -(auVar70[2] == '\0');
  auVar63[3] = -(auVar70[3] == '\0');
  auVar63[4] = -(auVar70[4] == '\0');
  auVar63[5] = -(auVar70[5] == '\0');
  auVar63[6] = -(auVar70[6] == '\0');
  auVar63[7] = -(auVar70[7] == '\0');
  auVar63[8] = -(auVar70[8] == '\0');
  auVar63[9] = -(auVar70[9] == '\0');
  auVar63[10] = -(auVar70[10] == '\0');
  auVar63[0xb] = -(auVar70[0xb] == '\0');
  auVar63[0xc] = -(auVar70[0xc] == '\0');
  auVar63[0xd] = -(auVar70[0xd] == '\0');
  auVar63[0xe] = -(auVar70[0xe] == '\0');
  auVar63[0xf] = -(auVar70[0xf] == '\0');
  out[0x13] = auVar68._0_2_;
  out[0x1c] = auVar64._14_2_;
  return (uint)((ushort)((ushort)(SUB161(auVar101 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar101 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar101 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar101 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar101 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar101 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar101 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar101 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar101 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar101 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar101 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar101 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar101 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar101 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar101 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar101[0xf] >> 7) << 0xf) != 0xffff) +
         (uint)((ushort)((ushort)(SUB161(auVar63 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar63 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar63 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar63 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar63 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar63 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar63 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar63 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar63 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar63 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar63 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar63 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar63 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar63 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar63 >> 0x77,0) & 1) << 0xe |
                        (ushort)(auVar63[0xf] >> 7) << 0xf) != 0xffff) * 2;
}

Assistant:

static WEBP_INLINE int DoQuantizeBlock_SSE2(
    int16_t in[16], int16_t out[16],
    const uint16_t* WEBP_RESTRICT const sharpen,
    const VP8Matrix* WEBP_RESTRICT const mtx) {
  const __m128i max_coeff_2047 = _mm_set1_epi16(MAX_LEVEL);
  const __m128i zero = _mm_setzero_si128();
  __m128i coeff0, coeff8;
  __m128i out0, out8;
  __m128i packed_out;

  // Load all inputs.
  __m128i in0 = _mm_loadu_si128((__m128i*)&in[0]);
  __m128i in8 = _mm_loadu_si128((__m128i*)&in[8]);
  const __m128i iq0 = _mm_loadu_si128((const __m128i*)&mtx->iq_[0]);
  const __m128i iq8 = _mm_loadu_si128((const __m128i*)&mtx->iq_[8]);
  const __m128i q0 = _mm_loadu_si128((const __m128i*)&mtx->q_[0]);
  const __m128i q8 = _mm_loadu_si128((const __m128i*)&mtx->q_[8]);

  // extract sign(in)  (0x0000 if positive, 0xffff if negative)
  const __m128i sign0 = _mm_cmpgt_epi16(zero, in0);
  const __m128i sign8 = _mm_cmpgt_epi16(zero, in8);

  // coeff = abs(in) = (in ^ sign) - sign
  coeff0 = _mm_xor_si128(in0, sign0);
  coeff8 = _mm_xor_si128(in8, sign8);
  coeff0 = _mm_sub_epi16(coeff0, sign0);
  coeff8 = _mm_sub_epi16(coeff8, sign8);

  // coeff = abs(in) + sharpen
  if (sharpen != NULL) {
    const __m128i sharpen0 = _mm_loadu_si128((const __m128i*)&sharpen[0]);
    const __m128i sharpen8 = _mm_loadu_si128((const __m128i*)&sharpen[8]);
    coeff0 = _mm_add_epi16(coeff0, sharpen0);
    coeff8 = _mm_add_epi16(coeff8, sharpen8);
  }

  // out = (coeff * iQ + B) >> QFIX
  {
    // doing calculations with 32b precision (QFIX=17)
    // out = (coeff * iQ)
    const __m128i coeff_iQ0H = _mm_mulhi_epu16(coeff0, iq0);
    const __m128i coeff_iQ0L = _mm_mullo_epi16(coeff0, iq0);
    const __m128i coeff_iQ8H = _mm_mulhi_epu16(coeff8, iq8);
    const __m128i coeff_iQ8L = _mm_mullo_epi16(coeff8, iq8);
    __m128i out_00 = _mm_unpacklo_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_04 = _mm_unpackhi_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_08 = _mm_unpacklo_epi16(coeff_iQ8L, coeff_iQ8H);
    __m128i out_12 = _mm_unpackhi_epi16(coeff_iQ8L, coeff_iQ8H);
    // out = (coeff * iQ + B)
    const __m128i bias_00 = _mm_loadu_si128((const __m128i*)&mtx->bias_[0]);
    const __m128i bias_04 = _mm_loadu_si128((const __m128i*)&mtx->bias_[4]);
    const __m128i bias_08 = _mm_loadu_si128((const __m128i*)&mtx->bias_[8]);
    const __m128i bias_12 = _mm_loadu_si128((const __m128i*)&mtx->bias_[12]);
    out_00 = _mm_add_epi32(out_00, bias_00);
    out_04 = _mm_add_epi32(out_04, bias_04);
    out_08 = _mm_add_epi32(out_08, bias_08);
    out_12 = _mm_add_epi32(out_12, bias_12);
    // out = QUANTDIV(coeff, iQ, B, QFIX)
    out_00 = _mm_srai_epi32(out_00, QFIX);
    out_04 = _mm_srai_epi32(out_04, QFIX);
    out_08 = _mm_srai_epi32(out_08, QFIX);
    out_12 = _mm_srai_epi32(out_12, QFIX);

    // pack result as 16b
    out0 = _mm_packs_epi32(out_00, out_04);
    out8 = _mm_packs_epi32(out_08, out_12);

    // if (coeff > 2047) coeff = 2047
    out0 = _mm_min_epi16(out0, max_coeff_2047);
    out8 = _mm_min_epi16(out8, max_coeff_2047);
  }

  // get sign back (if (sign[j]) out_n = -out_n)
  out0 = _mm_xor_si128(out0, sign0);
  out8 = _mm_xor_si128(out8, sign8);
  out0 = _mm_sub_epi16(out0, sign0);
  out8 = _mm_sub_epi16(out8, sign8);

  // in = out * Q
  in0 = _mm_mullo_epi16(out0, q0);
  in8 = _mm_mullo_epi16(out8, q8);

  _mm_storeu_si128((__m128i*)&in[0], in0);
  _mm_storeu_si128((__m128i*)&in[8], in8);

  // zigzag the output before storing it.
  //
  // The zigzag pattern can almost be reproduced with a small sequence of
  // shuffles. After it, we only need to swap the 7th (ending up in third
  // position instead of twelfth) and 8th values.
  {
    __m128i outZ0, outZ8;
    outZ0 = _mm_shufflehi_epi16(out0,  _MM_SHUFFLE(2, 1, 3, 0));
    outZ0 = _mm_shuffle_epi32  (outZ0, _MM_SHUFFLE(3, 1, 2, 0));
    outZ0 = _mm_shufflehi_epi16(outZ0, _MM_SHUFFLE(3, 1, 0, 2));
    outZ8 = _mm_shufflelo_epi16(out8,  _MM_SHUFFLE(3, 0, 2, 1));
    outZ8 = _mm_shuffle_epi32  (outZ8, _MM_SHUFFLE(3, 1, 2, 0));
    outZ8 = _mm_shufflelo_epi16(outZ8, _MM_SHUFFLE(1, 3, 2, 0));
    _mm_storeu_si128((__m128i*)&out[0], outZ0);
    _mm_storeu_si128((__m128i*)&out[8], outZ8);
    packed_out = _mm_packs_epi16(outZ0, outZ8);
  }
  {
    const int16_t outZ_12 = out[12];
    const int16_t outZ_3 = out[3];
    out[3] = outZ_12;
    out[12] = outZ_3;
  }

  // detect if all 'out' values are zeroes or not
  return (_mm_movemask_epi8(_mm_cmpeq_epi8(packed_out, zero)) != 0xffff);
}